

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_resolv_gai.c
# Opt level: O0

int parse_ip(char *addr,nng_sockaddr *sa,_Bool want_port)

{
  bool bVar1;
  bool bVar2;
  int errnum;
  char *local_c8;
  char *s;
  char local_b8 [6];
  _Bool wrapped;
  _Bool v6;
  char buf [64];
  char *local_70;
  char *host;
  char *port;
  addrinfo *paStack_58;
  int rv;
  addrinfo *results;
  addrinfo hints;
  _Bool want_port_local;
  nng_sockaddr *sa_local;
  char *addr_local;
  
  bVar2 = false;
  bVar1 = false;
  sa_local = (nng_sockaddr *)addr;
  if (addr == (char *)0x0) {
    sa_local = (nng_sockaddr *)0x1632a4;
  }
  hints.ai_next._7_1_ = want_port;
  snprintf(local_b8,0x40,"%s",sa_local);
  local_70 = local_b8;
  local_c8 = local_70;
  if (local_b8[0] == '[') {
    bVar2 = true;
    bVar1 = true;
    local_70 = local_b8 + 1;
  }
  else {
    while( true ) {
      if ((*local_c8 == '\0') || (*local_c8 == '.')) goto LAB_0012a2f6;
      if (*local_c8 == ':') break;
      local_c8 = local_c8 + 1;
    }
    bVar2 = true;
  }
LAB_0012a2f6:
  host = local_70;
  do {
    if (*host == '\0') {
LAB_0012a367:
      if (bVar1) {
        port._4_4_ = 0xf;
      }
      else if (((hints.ai_next._7_1_ & 1) == 0) && (*host != '\0')) {
        port._4_4_ = 0xf;
      }
      else {
        if (*host == ':') {
          *host = '\0';
          host = host + 1;
        }
        if (*host == '\0') {
          host = "0";
        }
        memset(&results,0,0x30);
        if (bVar2) {
          results._4_4_ = 10;
        }
        results._0_4_ = 0x425;
        errnum = getaddrinfo(local_70,host,(addrinfo *)&results,&stack0xffffffffffffffa8);
        if ((errnum == 0) && (paStack_58 != (addrinfo *)0x0)) {
          nni_posix_sockaddr2nn(sa,paStack_58->ai_addr,(ulong)paStack_58->ai_addrlen);
          freeaddrinfo(paStack_58);
          port._4_4_ = 0;
        }
        else {
          port._4_4_ = nni_plat_errno(errnum);
        }
      }
      return port._4_4_;
    }
    if (bVar1) {
      if (*host == ']') {
        *host = '\0';
        bVar1 = false;
        host = host + 1;
        goto LAB_0012a367;
      }
    }
    else if ((!bVar2) && (*host == ':')) goto LAB_0012a367;
    host = host + 1;
  } while( true );
}

Assistant:

int
parse_ip(const char *addr, nng_sockaddr *sa, bool want_port)
{
	struct addrinfo  hints;
	struct addrinfo *results;
	int              rv;
	char            *port;
	char            *host;
	char             buf[64];

#ifdef NNG_ENABLE_IPV6
	bool  v6      = false;
	bool  wrapped = false;
	char *s;
#endif

	if (addr == NULL) {
		addr = "";
	}

	snprintf(buf, sizeof(buf), "%s", addr);
	host = buf;
#ifdef NNG_ENABLE_IPV6
	if (*host == '[') {
		v6      = true;
		wrapped = true;
		host++;
	} else {
		for (s = host; *s != '\0'; s++) {
			if (*s == '.') {
				break;
			}
			if (*s == ':') {
				v6 = true;
				break;
			}
		}
	}
	for (port = host; *port != '\0'; port++) {
		if (wrapped) {
			if (*port == ']') {
				*port++ = '\0';
				wrapped = false;
				break;
			}
		} else if (!v6) {
			if (*port == ':') {
				break;
			}
		}
	}

	if (wrapped) {
		// Never got the closing bracket.
		rv = NNG_EADDRINVAL;
		goto done;
	}
#else  // NNG_ENABLE_IPV6
	for (port = host; *port != '\0'; port++) {
		if (*port == ':') {
			break;
		}
	}
#endif // NNG_ENABLE_IPV6

	if ((!want_port) && (*port != '\0')) {
		rv = NNG_EADDRINVAL;
		goto done;
	} else if (*port == ':') {
		*port++ = '\0';
	}

	if (*port == '\0') {
		port = "0";
	}

	memset(&hints, 0, sizeof(hints));
	hints.ai_flags = AI_NUMERICSERV | AI_NUMERICHOST | AI_PASSIVE;
#ifdef NNG_ENABLE_IPV6
	if (v6) {
		hints.ai_family = AF_INET6;
	}
#else
	hints.ai_family = AF_INET;
#endif
#ifdef AI_ADDRCONFIG
	hints.ai_flags |= AI_ADDRCONFIG;
#endif

	rv = getaddrinfo(host, port, &hints, &results);
	if ((rv != 0) || (results == NULL)) {
		rv = nni_plat_errno(rv);
		goto done;
	}
	nni_posix_sockaddr2nn(
	    sa, (void *) results->ai_addr, results->ai_addrlen);
	freeaddrinfo(results);

done:
	return (rv);
}